

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

int EncodeStreamHook(void *input,void *data2)

{
  uint32_t *palette;
  VP8LBackwardRefs *refs;
  uint32_t *palette_00;
  VP8LHashChain *hash_chain;
  int *piVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int width;
  int height;
  uint32_t color;
  long lVar7;
  WebPPicture *picture;
  VP8LBitWriter *bw;
  VP8LEncoder *enc;
  long lVar8;
  WebPPicture *pWVar9;
  code *pcVar10;
  uint uVar11;
  void *pvVar12;
  int iVar13;
  uint uVar14;
  uint32_t uVar15;
  WebPEncodingError WVar16;
  WebPEncodingError WVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  size_t sVar24;
  ulong uVar25;
  long lVar26;
  uint8_t *ptr;
  ulong uVar27;
  void *ptr_00;
  void *ptr_01;
  HuffmanTree *huff_tree;
  uint16_t *puVar28;
  uint16_t *puVar29;
  VP8LHistogramSet *image_histo;
  HuffmanTreeCode *huffman_codes;
  uint32_t *puVar30;
  ulong uVar31;
  ulong uVar32;
  HuffmanTreeToken *tokens;
  size_t sVar33;
  size_t sVar34;
  size_t sVar35;
  byte bVar36;
  uint32_t left_idx;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  byte bVar40;
  int quality;
  uint16_t *puVar41;
  uint64_t nmemb;
  byte bVar42;
  VP8LEncoderARGBContent VVar43;
  uint32_t uVar44;
  long lVar45;
  byte bVar46;
  uint uVar47;
  int iVar48;
  long lVar49;
  uint *puVar50;
  ulong uVar51;
  ulong uVar52;
  uint32_t *puVar53;
  uint8_t uVar54;
  uint32_t uVar55;
  long lVar56;
  ulong uVar57;
  HuffmanTreeCode *huffman_code;
  uint32_t best_score;
  uint uVar58;
  uint uVar59;
  void *pvVar60;
  bool bVar61;
  uint32_t *local_1ac8;
  void *local_1aa8;
  VP8LHistogram *local_1a88;
  int local_1a58;
  ulong local_1a48;
  ulong local_1a28;
  int local_1a10;
  VP8LBitWriter bw_best;
  VP8LBitWriter bw_init;
  undefined4 local_1938;
  uint32_t idx_map [256];
  VP8LHashChain hash_chain_histogram;
  uint16_t buffer [2048];
  
  lVar7 = *input;
  picture = *(WebPPicture **)((long)input + 8);
  bw = *(VP8LBitWriter **)((long)input + 0x10);
  enc = *(VP8LEncoder **)((long)input + 0x18);
  iVar3 = *(int *)((long)input + 0x20);
  uVar4 = *(uint *)((long)input + 0x104);
  quality = (int)*(float *)(lVar7 + 4);
  iVar5 = *(int *)((long)input + 0x108);
  lVar8 = *(long *)((long)input + 0x110);
  iVar6 = *(int *)(lVar7 + 8);
  width = picture->width;
  height = picture->height;
  sVar24 = VP8LBitWriterNumBytes(bw);
  bw_init.bits_ = bw->bits_;
  bw_init.used_ = bw->used_;
  bw_init._12_4_ = *(undefined4 *)&bw->field_0xc;
  bw_init.buf_ = bw->buf_;
  bw_init.cur_ = bw->cur_;
  bw_init.end_ = bw->end_;
  bw_init.error_ = bw->error_;
  bw_init._44_4_ = *(undefined4 *)&bw->field_0x2c;
  iVar13 = VP8LBitWriterInit(&bw_best,0);
  WVar16 = VP8_ENC_ERROR_OUT_OF_MEMORY;
  if ((iVar13 != 0) && (((int)uVar4 < 2 || (iVar13 = VP8LBitWriterClone(bw,&bw_best), iVar13 != 0)))
     ) {
    refs = enc->refs_;
    palette_00 = enc->palette_sorted_;
    palette = enc->palette_;
    hash_chain = &enc->hash_chain_;
    uVar25 = 0;
    if (0 < (int)uVar4) {
      uVar25 = (ulong)uVar4;
    }
    local_1a58 = 0;
    iVar13 = 0;
    local_1a48 = 0xffffffffffffffff;
    for (uVar39 = 0; uVar39 != uVar25; uVar39 = uVar39 + 1) {
      lVar26 = uVar39 * 0x1c;
      uVar23 = *(uint *)((long)input + lVar26 + 0x24);
      uVar37 = uVar23 & 0xfffffffe;
      VVar43 = kEncoderNone;
      uVar14 = (uint)(uVar23 == 5 || (uVar23 & 0xfffffffd) == 1);
      uVar23 = 0;
      if (iVar5 == 0) {
        uVar23 = uVar14;
      }
      if (uVar37 == 4) {
        uVar23 = 0;
      }
      enc->use_palette_ = (uint)(uVar37 == 4);
      enc->use_subtract_green_ = (uint)(uVar37 == 2);
      enc->use_predict_ = uVar14;
      if (iVar6 == 0) {
        uVar23 = 0;
      }
      enc->use_cross_color_ = uVar23;
      enc->cache_bits_ = 0;
      VP8LBackwardRefsClear(refs);
      VP8LBackwardRefsClear(enc->refs_ + 1);
      iVar20 = *(int *)(lVar7 + 0x5c);
      uVar23 = (uint)(iVar6 == 0);
      if (iVar20 < 100) {
        if (enc->use_palette_ != 0) {
          enc->argb_content_ = kEncoderNone;
          goto LAB_0012ab88;
        }
        if (enc->use_predict_ != 0) {
          enc->argb_content_ = kEncoderNone;
          goto LAB_0012b08f;
        }
        WVar16 = AllocateTransformBuffer(enc,width,height);
        if (WVar16 != VP8_ENC_OK) goto LAB_0012c0df;
        VVar43 = kEncoderNearLossless;
        if (enc->argb_content_ != kEncoderNearLossless) {
          iVar18 = VP8ApplyNearLossless(picture,*(int *)(lVar7 + 0x5c),enc->argb_);
          VVar43 = kEncoderNearLossless;
          WVar16 = VP8_ENC_ERROR_OUT_OF_MEMORY;
          if (iVar18 != 0) goto LAB_0012ab7b;
          goto LAB_0012c0e3;
        }
      }
LAB_0012ab7b:
      enc->argb_content_ = VVar43;
      if (enc->use_palette_ == 0) {
        if (99 < iVar20) {
LAB_0012b08f:
          pWVar9 = enc->pic_;
          iVar20 = pWVar9->width;
          iVar18 = pWVar9->height;
          WVar16 = AllocateTransformBuffer(enc,iVar20,iVar18);
          if (WVar16 != VP8_ENC_OK) goto LAB_0012c0df;
          if (enc->argb_content_ != kEncoderARGB) {
            puVar30 = enc->argb_;
            puVar53 = pWVar9->argb;
            if (iVar18 < 1) {
              iVar18 = 0;
            }
            while (bVar61 = iVar18 != 0, iVar18 = iVar18 + -1, bVar61) {
              memcpy(puVar30,puVar53,(long)iVar20 * 4);
              puVar53 = puVar53 + pWVar9->argb_stride;
              puVar30 = puVar30 + iVar20;
            }
            enc->argb_content_ = kEncoderARGB;
          }
        }
      }
      else {
LAB_0012ab88:
        iVar20 = *(int *)((long)input + lVar26 + 0x28);
        if (iVar20 == 1) {
          uVar14 = enc->palette_size_;
          memcpy(palette,palette_00,(long)(int)uVar14 << 2);
          uVar57 = 0;
          uVar27 = 0;
          if (0 < (int)uVar14) {
            uVar27 = (ulong)uVar14;
          }
          bVar42 = 0;
          uVar15 = 0;
          for (; uVar27 != uVar57; uVar57 = uVar57 + 1) {
            uVar44 = palette_00[uVar57];
            uVar15 = VP8LSubPixels(uVar44,uVar15);
            uVar37 = uVar15 >> 0x10 & 0xff;
            bVar46 = 2 - (uVar37 < 0x80);
            if (uVar37 == 0) {
              bVar46 = (byte)(uVar15 >> 0x10);
            }
            uVar37 = uVar15 >> 8 & 0xff;
            bVar36 = (0x7f < uVar37) * '\b' + 8;
            if (uVar37 == 0) {
              bVar36 = (byte)(uVar15 >> 8);
            }
            bVar40 = 0x80;
            if ((uVar15 & 0xff) < 0x80) {
              bVar40 = 0x40;
            }
            if ((uVar15 & 0xff) == 0) {
              bVar40 = (byte)uVar15;
            }
            bVar42 = bVar40 | bVar46 | bVar36 | bVar42;
            uVar15 = uVar44;
          }
          if ((bVar42 * '\x02' & bVar42) != 0) {
            uVar15 = 0;
            for (uVar57 = 0; uVar37 = 0xffffffff, uVar57 != uVar27; uVar57 = uVar57 + 1) {
              uVar32 = uVar57 & 0xffffffff;
              for (uVar31 = uVar57; uVar14 != uVar31; uVar31 = uVar31 + 1) {
                uVar44 = VP8LSubPixels(palette[uVar31],uVar15);
                uVar59 = uVar44 & 0xff;
                uVar58 = 0x100 - uVar59;
                if (uVar59 < 0x81) {
                  uVar58 = uVar59;
                }
                uVar19 = uVar44 >> 8 & 0xff;
                uVar59 = 0x100 - uVar19;
                if (uVar19 < 0x81) {
                  uVar59 = uVar19;
                }
                uVar47 = uVar44 >> 0x10 & 0xff;
                uVar19 = 0x100 - uVar47;
                if (uVar47 < 0x81) {
                  uVar19 = uVar47;
                }
                uVar47 = 0x100 - (uVar44 >> 0x18);
                if (uVar44 < 0x81000000) {
                  uVar47 = uVar44 >> 0x18;
                }
                uVar47 = uVar47 + (uVar19 + uVar59 + uVar58) * 9;
                if (uVar47 < uVar37) {
                  uVar32 = uVar31 & 0xffffffff;
                }
                if (uVar47 <= uVar37) {
                  uVar37 = uVar47;
                }
              }
              uVar15 = palette[(int)uVar32];
              palette[(int)uVar32] = palette[uVar57];
              palette[uVar57] = uVar15;
            }
          }
        }
        else if (iVar20 == 0) {
          memcpy(palette,palette_00,(long)enc->palette_size_ << 2);
        }
        else {
          uVar14 = enc->palette_size_;
          uVar57 = (ulong)uVar14;
          if (1 < uVar57) {
            pWVar9 = enc->pic_;
            ptr_00 = WebPSafeCalloc((ulong)(uVar14 * uVar14),4);
            if (ptr_00 != (void *)0x0) {
              puVar50 = pWVar9->argb;
              uVar37 = *puVar50;
              memset(idx_map,0,0x400);
              ptr_01 = WebPSafeMalloc((long)pWVar9->width * 2,4);
              if (ptr_01 != (void *)0x0) {
                uVar44 = ~uVar37;
                iVar20 = pWVar9->width;
                PrepareMapToPalette(palette_00,uVar14,(uint32_t *)&hash_chain_histogram,idx_map);
                uVar15 = 0;
                pvVar12 = (void *)((long)ptr_01 + (long)iVar20 * 4);
                local_1aa8 = ptr_01;
                for (iVar18 = 0; pvVar60 = pvVar12, iVar18 < pWVar9->height; iVar18 = iVar18 + 1) {
                  for (lVar49 = 0; lVar49 < pWVar9->width; lVar49 = lVar49 + 1) {
                    uVar55 = puVar50[lVar49];
                    if (uVar55 != uVar44) {
                      iVar20 = SearchColorNoIdx((uint32_t *)&hash_chain_histogram,uVar55,uVar14);
                      uVar15 = idx_map[iVar20];
                      uVar44 = uVar55;
                    }
                    *(uint32_t *)((long)pvVar60 + lVar49 * 4) = uVar15;
                    if ((lVar49 != 0) &&
                       (uVar55 = *(uint32_t *)((long)pvVar60 + lVar49 * 4 + -4), uVar15 != uVar55))
                    {
                      piVar1 = (int *)((long)ptr_00 + (ulong)(uVar15 * uVar14 + uVar55) * 4);
                      *piVar1 = *piVar1 + 1;
                      piVar1 = (int *)((long)ptr_00 + (ulong)(uVar14 * uVar55 + uVar15) * 4);
                      *piVar1 = *piVar1 + 1;
                    }
                    if ((iVar18 != 0) &&
                       (uVar55 = *(uint32_t *)((long)local_1aa8 + lVar49 * 4), uVar15 != uVar55)) {
                      piVar1 = (int *)((long)ptr_00 + (ulong)(uVar15 * uVar14 + uVar55) * 4);
                      *piVar1 = *piVar1 + 1;
                      piVar1 = (int *)((long)ptr_00 + (ulong)(uVar14 * uVar55 + uVar15) * 4);
                      *piVar1 = *piVar1 + 1;
                    }
                  }
                  puVar50 = puVar50 + pWVar9->argb_stride;
                  pvVar12 = local_1aa8;
                  local_1aa8 = pvVar60;
                }
                WebPSafeFree(ptr_01);
                uVar58 = 0;
                uVar27 = 0;
                uVar37 = 0;
                uVar59 = 0;
                while( true ) {
                  uVar31 = uVar27 & 0xff;
                  if (uVar59 == uVar14) break;
                  uVar47 = 0;
                  uVar27 = uVar57;
                  uVar19 = uVar58;
                  while( true ) {
                    bVar61 = uVar27 == 0;
                    uVar27 = uVar27 - 1;
                    if (bVar61) break;
                    uVar47 = uVar47 + *(int *)((long)ptr_00 + (ulong)uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  }
                  uVar19 = (uint)uVar31;
                  if (uVar37 < uVar47) {
                    uVar37 = uVar47;
                    uVar19 = uVar59;
                  }
                  uVar59 = uVar59 + 1;
                  uVar58 = uVar58 + uVar14;
                  uVar27 = (ulong)uVar19;
                }
                uVar32 = 0;
                uVar51 = 0;
                uVar37 = 0;
                while( true ) {
                  uVar38 = uVar51 & 0xff;
                  if (uVar57 == uVar32) break;
                  uVar58 = *(uint *)((long)ptr_00 +
                                    (ulong)(uVar14 * (uint)uVar31 + (uint)uVar32) * 4);
                  uVar59 = (uint)uVar38;
                  if (uVar37 < uVar58) {
                    uVar37 = uVar58;
                    uVar59 = (uint)uVar32;
                  }
                  uVar32 = uVar32 + 1;
                  uVar51 = (ulong)uVar59;
                }
                local_1938._0_2_ = CONCAT11((char)uVar51,(char)uVar27);
                if (uVar14 - 2 == 0) {
                  uVar37 = 0;
                }
                else {
                  buffer._0_8_ = ((ulong)buffer._0_8_ >> 8 & 0xffffff) << 8;
                  puVar28 = buffer;
                  uVar37 = 0;
                  uVar32 = uVar38;
                  for (uVar51 = 0; uVar57 != uVar51; uVar51 = uVar51 + 1) {
                    if (((uVar27 & 0xff) != uVar51) && (uVar38 != uVar51)) {
                      uVar52 = (ulong)uVar37;
                      *(char *)(buffer + uVar52 * 4) = (char)uVar51;
                      uVar58 = *(int *)((long)ptr_00 + uVar32 * 4) +
                               *(int *)((long)ptr_00 + uVar31 * 4);
                      *(uint *)(buffer + uVar52 * 4 + 2) = uVar58;
                      if (*(uint *)(puVar28 + 2) < uVar58) {
                        puVar28 = buffer + uVar52 * 4;
                      }
                      uVar37 = uVar37 + 1;
                    }
                    uVar32 = (ulong)((int)uVar32 + uVar14);
                    uVar31 = (ulong)((int)uVar31 + uVar14);
                  }
                  uVar27 = (ulong)(uVar14 - 2);
                  uVar59 = uVar14 - 3;
                  uVar37 = 0;
                  iVar20 = 1;
                  uVar58 = 1;
                  while (bVar61 = uVar27 != 0, uVar27 = uVar27 - 1, bVar61) {
                    uVar31 = (ulong)uVar59;
                    uVar47 = uVar58 + 1;
                    iVar21 = (byte)*puVar28 * uVar14;
                    iVar48 = 0;
                    iVar18 = iVar20;
                    for (uVar19 = uVar37; (uint)((ulong)uVar19 % uVar57) != uVar47;
                        uVar19 = uVar19 + 1) {
                      iVar48 = iVar48 + *(int *)((long)ptr_00 +
                                                (ulong)((uint)*(byte *)((long)&local_1938 +
                                                                       (ulong)uVar19 % uVar57) +
                                                       iVar21) * 4) * iVar18;
                      iVar18 = iVar18 + -2;
                    }
                    uVar19 = uVar14;
                    if (uVar37 != 0) {
                      uVar19 = uVar37;
                    }
                    uVar11 = uVar47;
                    if (0 < iVar48) {
                      uVar11 = uVar19 - 1;
                    }
                    if (0 < iVar48) {
                      uVar37 = uVar19 - 1;
                    }
                    *(byte *)((long)&local_1938 + (ulong)uVar11) = (byte)*puVar28;
                    *(undefined8 *)puVar28 = *(undefined8 *)(buffer + (uVar27 & 0xffffffff) * 4);
                    puVar29 = buffer;
                    puVar28 = puVar29;
                    while (bVar61 = uVar31 != 0, uVar31 = uVar31 - 1, bVar61) {
                      uVar19 = *(int *)(puVar29 + 2) +
                               *(int *)((long)ptr_00 + (ulong)((uint)(byte)*puVar29 + iVar21) * 4);
                      *(uint *)(puVar29 + 2) = uVar19;
                      puVar41 = puVar29;
                      if (uVar19 <= *(uint *)(puVar28 + 2)) {
                        puVar41 = puVar28;
                      }
                      puVar29 = puVar29 + 4;
                      puVar28 = puVar41;
                    }
                    if (iVar48 < 1) {
                      uVar58 = uVar47;
                    }
                    uVar59 = uVar59 - 1;
                    iVar20 = iVar20 + 1;
                  }
                }
                WebPSafeFree(ptr_00);
                for (uVar27 = 0; uVar57 != uVar27; uVar27 = uVar27 + 1) {
                  palette[uVar27] =
                       palette_00
                       [*(byte *)((long)&local_1938 + (ulong)(uVar37 + (int)uVar27) % uVar57)];
                }
                goto LAB_0012ad68;
              }
              WebPSafeFree(ptr_00);
            }
LAB_0012c0df:
            WVar16 = VP8_ENC_ERROR_OUT_OF_MEMORY;
            goto LAB_0012c0e3;
          }
        }
LAB_0012ad68:
        iVar20 = enc->palette_size_;
        VP8LPutBits(bw,1,1);
        VP8LPutBits(bw,3,2);
        uVar14 = iVar20 - 1;
        VP8LPutBits(bw,uVar14,8);
        for (uVar57 = (ulong)uVar14; 0 < (int)uVar57; uVar57 = uVar57 - 1) {
          uVar15 = VP8LSubPixels(palette[uVar57],enc->palette_[uVar57 - 1]);
          *(uint32_t *)(buffer + uVar57 * 2) = uVar15;
        }
        buffer._0_4_ = *palette;
        WVar16 = EncodeImageNoHuffman(bw,(uint32_t *)buffer,hash_chain,refs,iVar20,1,0x14,uVar23);
        if (WVar16 != VP8_ENC_OK) goto LAB_0012c0e3;
        pWVar9 = enc->pic_;
        uVar14 = pWVar9->width;
        iVar20 = pWVar9->height;
        puVar53 = pWVar9->argb;
        uVar37 = pWVar9->argb_stride;
        uVar15 = enc->palette_size_;
        lVar49 = (long)(int)uVar15;
        uVar58 = (uint)(lVar49 < 0x11);
        if (lVar49 < 5) {
          uVar58 = lVar49 < 3 | 2;
        }
        WVar17 = AllocateTransformBuffer
                           (enc,((1 << (sbyte)uVar58) + uVar14) - 1 >> (sbyte)uVar58,iVar20);
        WVar16 = VP8_ENC_ERROR_OUT_OF_MEMORY;
        if (WVar17 != VP8_ENC_OK) goto LAB_0012c0e3;
        local_1ac8 = enc->argb_;
        uVar59 = enc->current_width_;
        ptr = (uint8_t *)WebPSafeMalloc((long)(int)uVar14,1);
        if (ptr == (uint8_t *)0x0) {
          enc->argb_content_ = kEncoderPalette;
          goto LAB_0012c0e3;
        }
        if (3 < (int)uVar15) {
          lVar45 = 0;
LAB_0012af5d:
          if (lVar45 == 3) {
LAB_0012b39e:
            PrepareMapToPalette(palette,uVar15,(uint32_t *)&hash_chain_histogram,idx_map);
            uVar44 = *palette;
            iVar18 = 0;
            uVar57 = 0;
            if (0 < (int)uVar14) {
              uVar57 = (ulong)uVar14;
            }
            if (iVar20 < 1) {
              iVar20 = 0;
            }
            uVar55 = 0;
            for (; iVar18 != iVar20; iVar18 = iVar18 + 1) {
              for (uVar27 = 0; uVar57 != uVar27; uVar27 = uVar27 + 1) {
                color = puVar53[uVar27];
                if (color != uVar44) {
                  iVar21 = SearchColorNoIdx((uint32_t *)&hash_chain_histogram,color,uVar15);
                  uVar55 = idx_map[iVar21];
                  uVar44 = color;
                }
                ptr[uVar27] = (uint8_t)uVar55;
              }
              (*VP8LBundleColorMap)(ptr,uVar14,uVar58,local_1ac8);
              local_1ac8 = local_1ac8 + uVar59;
              puVar53 = puVar53 + uVar37;
            }
          }
          else {
            memset(buffer,0xff,0x1000);
            pcVar10 = (code *)(&PTR_ApplyPaletteHash0_00150d60)[lVar45];
            lVar56 = 0;
LAB_0012af8c:
            if (lVar49 != lVar56) goto code_r0x0012af93;
            iVar18 = (int)lVar45;
            if (iVar18 == 2) {
              uVar19 = *palette;
              iVar18 = 0;
              uVar57 = 0;
              if (0 < (int)uVar14) {
                uVar57 = (ulong)uVar14;
              }
              if (iVar20 < 1) {
                iVar20 = iVar18;
              }
              uVar54 = '\0';
              for (; iVar18 != iVar20; iVar18 = iVar18 + 1) {
                for (uVar27 = 0; uVar57 != uVar27; uVar27 = uVar27 + 1) {
                  uVar47 = puVar53[uVar27];
                  if (uVar47 != uVar19) {
                    uVar54 = (uint8_t)buffer[(uVar47 & 0xffffff) * 0x7fffffff >> 0x15];
                    uVar19 = uVar47;
                  }
                  ptr[uVar27] = uVar54;
                }
                (*VP8LBundleColorMap)(ptr,uVar14,uVar58,local_1ac8);
                local_1ac8 = local_1ac8 + uVar59;
                puVar53 = puVar53 + uVar37;
              }
            }
            else {
              if (iVar18 != 1) {
                if (iVar18 == 0) {
                  uVar19 = *palette;
                  iVar18 = 0;
                  uVar57 = 0;
                  if (0 < (int)uVar14) {
                    uVar57 = (ulong)uVar14;
                  }
                  if (iVar20 < 1) {
                    iVar20 = iVar18;
                  }
                  uVar54 = '\0';
                  for (; iVar18 != iVar20; iVar18 = iVar18 + 1) {
                    for (uVar27 = 0; uVar57 != uVar27; uVar27 = uVar27 + 1) {
                      uVar47 = puVar53[uVar27];
                      if (uVar47 != uVar19) {
                        uVar54 = (uint8_t)buffer[uVar47 >> 8 & 0xff];
                        uVar19 = uVar47;
                      }
                      ptr[uVar27] = uVar54;
                    }
                    (*VP8LBundleColorMap)(ptr,uVar14,uVar58,local_1ac8);
                    local_1ac8 = local_1ac8 + uVar59;
                    puVar53 = puVar53 + uVar37;
                  }
                  goto LAB_0012b5c4;
                }
                goto LAB_0012b39e;
              }
              uVar19 = *palette;
              iVar18 = 0;
              uVar57 = 0;
              if (0 < (int)uVar14) {
                uVar57 = (ulong)uVar14;
              }
              if (iVar20 < 1) {
                iVar20 = iVar18;
              }
              uVar54 = '\0';
              for (; iVar18 != iVar20; iVar18 = iVar18 + 1) {
                for (uVar27 = 0; uVar57 != uVar27; uVar27 = uVar27 + 1) {
                  uVar47 = puVar53[uVar27];
                  if (uVar47 != uVar19) {
                    uVar54 = (uint8_t)buffer[(uVar47 & 0xffffff) * -0x455ab19 >> 0x15];
                    uVar19 = uVar47;
                  }
                  ptr[uVar27] = uVar54;
                }
                (*VP8LBundleColorMap)(ptr,uVar14,uVar58,local_1ac8);
                local_1ac8 = local_1ac8 + uVar59;
                puVar53 = puVar53 + uVar37;
              }
            }
          }
          goto LAB_0012b5c4;
        }
        uVar15 = *palette;
        bVar42 = 0;
        uVar57 = 0;
        if (0 < (int)uVar14) {
          uVar57 = (ulong)uVar14;
        }
        if (iVar20 < 1) {
          iVar20 = 0;
        }
        for (iVar18 = 0; iVar18 != iVar20; iVar18 = iVar18 + 1) {
          for (uVar27 = 0; uVar57 != uVar27; uVar27 = uVar27 + 1) {
            uVar44 = puVar53[uVar27];
            if (uVar44 != uVar15) {
              uVar15 = uVar44;
              if (*palette == uVar44) {
                bVar42 = 0;
              }
              else {
                bVar42 = 1;
                if (enc->palette_[1] != uVar44) {
                  bVar42 = enc->palette_[2] == uVar44 ^ 3;
                }
              }
            }
            ptr[uVar27] = bVar42;
          }
          (*VP8LBundleColorMap)(ptr,uVar14,uVar58,local_1ac8);
          local_1ac8 = local_1ac8 + uVar59;
          puVar53 = puVar53 + uVar37;
        }
LAB_0012b5c4:
        WebPSafeFree(ptr);
        enc->argb_content_ = kEncoderPalette;
        if ((iVar3 != 0) && (uVar14 = enc->palette_size_, (int)uVar14 < 0x400)) {
          uVar37 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar37 == 0; uVar37 = uVar37 - 1) {
            }
          }
          enc->cache_bits_ = (uVar37 ^ 0xffffffe0) + 0x21;
        }
      }
      if (enc->use_subtract_green_ != 0) {
        iVar20 = enc->current_width_;
        VP8LPutBits(bw,1,1);
        VP8LPutBits(bw,2,2);
        (*VP8LSubtractGreenFromBlueAndRed)(enc->argb_,iVar20 * height);
      }
      uVar14 = (uint)(iVar6 == 0);
      if (enc->use_predict_ != 0) {
        iVar20 = 100;
        if (enc->use_palette_ == 0) {
          iVar20 = enc->config_->near_lossless;
        }
        iVar18 = enc->transform_bits_;
        bVar42 = (byte)iVar18;
        iVar48 = 1 << (bVar42 & 0x1f);
        iVar21 = enc->current_width_;
        VP8LResidualImage(iVar21,height,iVar18,uVar14,enc->argb_,enc->argb_scratch_,
                          enc->transform_data_,iVar20,enc->config_->exact,enc->use_subtract_green_);
        VP8LPutBits(bw,1,1);
        VP8LPutBits(bw,0,2);
        VP8LPutBits(bw,iVar18 - 2,3);
        WVar16 = EncodeImageNoHuffman
                           (bw,enc->transform_data_,hash_chain,refs,
                            (iVar21 + iVar48) - 1U >> (bVar42 & 0x1f),
                            (uint)(height + -1 + iVar48) >> (bVar42 & 0x1f),quality,uVar14);
        if (WVar16 != VP8_ENC_OK) goto LAB_0012c0e3;
      }
      if (enc->use_cross_color_ != 0) {
        iVar20 = enc->transform_bits_;
        bVar42 = (byte)iVar20;
        iVar18 = enc->current_width_;
        uVar37 = ~(-1 << (bVar42 & 0x1f));
        VP8LColorSpaceTransform(iVar18,height,iVar20,quality,enc->argb_,enc->transform_data_);
        VP8LPutBits(bw,1,1);
        VP8LPutBits(bw,1,2);
        VP8LPutBits(bw,iVar20 - 2,3);
        WVar16 = EncodeImageNoHuffman
                           (bw,enc->transform_data_,hash_chain,refs,
                            iVar18 + uVar37 >> (bVar42 & 0x1f),uVar37 + height >> (bVar42 & 0x1f),
                            quality,uVar14);
        if (WVar16 != VP8_ENC_OK) goto LAB_0012c0e3;
      }
      WVar16 = VP8_ENC_ERROR_OUT_OF_MEMORY;
      VP8LPutBits(bw,0,1);
      iVar20 = enc->histo_bits_;
      bVar42 = (byte)iVar20;
      iVar18 = enc->current_width_;
      uVar58 = ~(-1 << (bVar42 & 0x1f));
      uVar37 = iVar18 + uVar58 >> (bVar42 & 0x1f);
      uVar59 = uVar58 + height >> (bVar42 & 0x1f);
      puVar53 = enc->argb_;
      uVar58 = uVar37 * uVar59;
      uVar57 = (ulong)uVar58;
      huff_tree = (HuffmanTree *)WebPSafeMalloc(0x39,0x10);
      puVar28 = (uint16_t *)WebPSafeMalloc(uVar57,2);
      buffer._0_8_ = bw->bits_;
      buffer._8_8_ = *(undefined8 *)&bw->used_;
      buffer._16_8_ = bw->buf_;
      buffer._24_8_ = bw->cur_;
      buffer._32_8_ = bw->end_;
      buffer._40_8_ = *(undefined8 *)&bw->error_;
      hash_chain_histogram.offset_length_ = (uint32_t *)0x0;
      hash_chain_histogram.size_ = 0;
      hash_chain_histogram._12_4_ = 0;
      local_1a10 = (int)sVar24;
      if ((huff_tree == (HuffmanTree *)0x0) || (puVar28 == (uint16_t *)0x0)) {
        huffman_codes = (HuffmanTreeCode *)0x0;
        tokens = (HuffmanTreeToken *)0x0;
        local_1a88 = (VP8LHistogram *)0x0;
        image_histo = (VP8LHistogramSet *)0x0;
      }
      else {
        iVar21 = VP8LHashChainInit(&hash_chain_histogram,uVar58);
        if ((iVar21 != 0) &&
           (iVar21 = VP8LHashChainFill(hash_chain,quality,puVar53,iVar18,height,uVar23), iVar21 != 0
           )) {
          if (iVar3 == 0) {
            iVar21 = 0;
          }
          else {
            iVar21 = enc->cache_bits_;
            if (iVar21 == 0) {
              iVar21 = 10;
            }
          }
          iVar48 = VP8LBitWriterInit((VP8LBitWriter *)idx_map,0);
          if ((iVar48 != 0) &&
             (((*(int *)((long)input + lVar26 + 0x3c) < 2 &&
               (*(int *)((long)input + lVar26 + 0x30) == 0)) ||
              (iVar48 = VP8LBitWriterClone(bw,(VP8LBitWriter *)idx_map), iVar48 != 0)))) {
            local_1a28 = 0xffffffffffffffff;
            for (lVar49 = 0; lVar49 < *(int *)((long)input + lVar26 + 0x3c); lVar49 = lVar49 + 1) {
              WVar16 = VP8LGetBackwardReferences
                                 (iVar18,height,puVar53,quality,uVar14,
                                  *(int *)((long)input + lVar49 * 8 + lVar26 + 0x2c),iVar21,
                                  *(int *)((long)input + lVar49 * 8 + lVar26 + 0x30),hash_chain,refs
                                  ,&local_1938);
              if (WVar16 != VP8_ENC_OK) {
                huffman_codes = (HuffmanTreeCode *)0x0;
                tokens = (HuffmanTreeToken *)0x0;
                local_1a88 = (VP8LHistogram *)0x0;
                image_histo = (VP8LHistogramSet *)0x0;
                goto LAB_0012be7c;
              }
              for (uVar27 = 0;
                  uVar27 < 2 - (ulong)(*(int *)((long)input + lVar49 * 8 + lVar26 + 0x30) == 0);
                  uVar27 = uVar27 + 1) {
                uVar15 = 0;
                if (uVar27 == 0) {
                  uVar15 = local_1938;
                }
                if (uVar27 == 1 && local_1938 == 0) break;
                VP8LBitWriterReset((VP8LBitWriter *)buffer,bw);
                image_histo = VP8LAllocateHistogramSet(uVar58,uVar15);
                local_1a88 = VP8LAllocateHistogram(uVar15);
                huffman_codes = (HuffmanTreeCode *)0x0;
                if ((image_histo == (VP8LHistogramSet *)0x0) || (local_1a88 == (VP8LHistogram *)0x0)
                   ) {
LAB_0012c03d:
                  tokens = (HuffmanTreeToken *)0x0;
                  WVar16 = VP8_ENC_OK;
                  goto LAB_0012be7c;
                }
                iVar48 = VP8LGetHistoImageSymbols
                                   (iVar18,height,refs + uVar27,quality,uVar14,iVar20,uVar15,
                                    image_histo,local_1a88,puVar28);
                if (iVar48 == 0) {
LAB_0012c028:
                  huffman_codes = (HuffmanTreeCode *)0x0;
                  goto LAB_0012c03d;
                }
                iVar48 = image_histo->size;
                nmemb = (long)iVar48 * 5;
                huffman_codes = (HuffmanTreeCode *)WebPSafeCalloc(nmemb,0x18);
                if (huffman_codes == (HuffmanTreeCode *)0x0) goto LAB_0012c028;
                iVar22 = GetHuffBitLengthsAndCodes(image_histo,huffman_codes);
                if (iVar22 == 0) goto LAB_0012c03d;
                VP8LFreeHistogramSet(image_histo);
                VP8LFreeHistogram(local_1a88);
                if ((int)uVar15 < 1) {
                  uVar44 = 0;
                  iVar22 = 1;
                }
                else {
                  VP8LPutBits(bw,1,1);
                  iVar22 = 4;
                  uVar44 = uVar15;
                }
                VP8LPutBits(bw,uVar44,iVar22);
                VP8LPutBits(bw,(uint)(1 < iVar48),1);
                if (1 < iVar48) {
                  puVar30 = (uint32_t *)WebPSafeMalloc(uVar57,4);
                  if (puVar30 == (uint32_t *)0x0) {
LAB_0012c02f:
                    local_1a88 = (VP8LHistogram *)0x0;
                    image_histo = (VP8LHistogramSet *)0x0;
                    goto LAB_0012c03d;
                  }
                  uVar23 = 0;
                  for (uVar31 = 0; uVar57 != uVar31; uVar31 = uVar31 + 1) {
                    uVar2 = puVar28[uVar31];
                    puVar30[uVar31] = (uint)uVar2 << 8;
                    if (uVar23 <= uVar2) {
                      uVar23 = uVar2 + 1;
                    }
                  }
                  VP8LPutBits(bw,iVar20 - 2,3);
                  WVar16 = EncodeImageNoHuffman
                                     (bw,puVar30,&hash_chain_histogram,enc->refs_ + 2,uVar37,uVar59,
                                      quality,uVar14);
                  WebPSafeFree(puVar30);
                  if (WVar16 == VP8_ENC_OK) {
                    nmemb = (uint64_t)(uVar23 * 5);
                    goto LAB_0012bd27;
                  }
                  tokens = (HuffmanTreeToken *)0x0;
                  local_1a88 = (VP8LHistogram *)0x0;
                  image_histo = (VP8LHistogramSet *)0x0;
                  goto LAB_0012be7c;
                }
LAB_0012bd27:
                uVar32 = 0;
                uVar31 = nmemb & 0xffffffff;
                if ((int)nmemb < 1) {
                  uVar31 = uVar32;
                }
                uVar23 = 0;
                for (; uVar31 * 0x18 - uVar32 != 0; uVar32 = uVar32 + 0x18) {
                  uVar19 = *(uint *)((long)&huffman_codes->num_symbols + uVar32);
                  if ((int)uVar23 <= (int)uVar19) {
                    uVar23 = uVar19;
                  }
                }
                tokens = (HuffmanTreeToken *)WebPSafeMalloc((ulong)uVar23,2);
                if (tokens == (HuffmanTreeToken *)0x0) goto LAB_0012c02f;
                for (lVar45 = 0; uVar31 * 0x18 - lVar45 != 0; lVar45 = lVar45 + 0x18) {
                  huffman_code = (HuffmanTreeCode *)((long)&huffman_codes->num_symbols + lVar45);
                  StoreHuffmanCode(bw,huff_tree,tokens,huffman_code);
                  ClearHuffmanTreeIfOnlyOneSymbol(huffman_code);
                }
                sVar33 = VP8LBitWriterNumBytes(bw);
                WVar16 = StoreImageToBitMask(bw,iVar18,iVar20,refs + uVar27,puVar28,huffman_codes);
                if (WVar16 != VP8_ENC_OK) {
                  local_1a88 = (VP8LHistogram *)0x0;
                  image_histo = (VP8LHistogramSet *)0x0;
                  WVar16 = VP8_ENC_ERROR_OUT_OF_MEMORY;
                  goto LAB_0012be7c;
                }
                sVar34 = VP8LBitWriterNumBytes(bw);
                if (sVar34 < local_1a28) {
                  local_1a58 = (int)sVar33 - local_1a10;
                  enc->cache_bits_ = uVar15;
                  sVar35 = VP8LBitWriterNumBytes(bw);
                  iVar13 = (int)sVar35 - (int)sVar33;
                  VP8LBitWriterSwap(bw,(VP8LBitWriter *)idx_map);
                  local_1a28 = sVar34;
                }
                WebPSafeFree(tokens);
                WebPSafeFree(huffman_codes->codes);
                WebPSafeFree(huffman_codes);
              }
            }
            VP8LBitWriterSwap(bw,(VP8LBitWriter *)idx_map);
            huffman_codes = (HuffmanTreeCode *)0x0;
            tokens = (HuffmanTreeToken *)0x0;
            local_1a88 = (VP8LHistogram *)0x0;
            image_histo = (VP8LHistogramSet *)0x0;
            WVar16 = VP8_ENC_OK;
            goto LAB_0012be7c;
          }
        }
        huffman_codes = (HuffmanTreeCode *)0x0;
        tokens = (HuffmanTreeToken *)0x0;
        local_1a88 = (VP8LHistogram *)0x0;
        image_histo = (VP8LHistogramSet *)(ulong)(0 >> (bVar42 & 0x1f));
        WVar16 = VP8_ENC_ERROR_OUT_OF_MEMORY;
      }
LAB_0012be7c:
      WebPSafeFree(tokens);
      WebPSafeFree(huff_tree);
      VP8LFreeHistogramSet(image_histo);
      VP8LFreeHistogram(local_1a88);
      VP8LHashChainClear(&hash_chain_histogram);
      if (huffman_codes != (HuffmanTreeCode *)0x0) {
        WebPSafeFree(huffman_codes->codes);
        WebPSafeFree(huffman_codes);
      }
      WebPSafeFree(puVar28);
      VP8LBitWriterWipeOut((VP8LBitWriter *)idx_map);
      if (WVar16 != VP8_ENC_OK) goto LAB_0012c0e3;
      sVar33 = VP8LBitWriterNumBytes(bw);
      if ((sVar33 < local_1a48) && (VP8LBitWriterSwap(bw,&bw_best), local_1a48 = sVar33, lVar8 != 0)
         ) {
        uVar23 = (uint)(enc->use_predict_ != 0);
        *(uint *)(lVar8 + 0x94) = uVar23;
        if (enc->use_cross_color_ != 0) {
          uVar23 = uVar23 | 2;
          *(uint *)(lVar8 + 0x94) = uVar23;
        }
        if (enc->use_subtract_green_ != 0) {
          uVar23 = uVar23 | 4;
          *(uint *)(lVar8 + 0x94) = uVar23;
        }
        if (enc->use_palette_ != 0) {
          *(uint *)(lVar8 + 0x94) = uVar23 | 8;
        }
        *(undefined8 *)(lVar8 + 0x98) = *(undefined8 *)&enc->histo_bits_;
        *(int *)(lVar8 + 0xa0) = enc->cache_bits_;
        *(int *)(lVar8 + 0xa4) = enc->palette_size_;
        *(int *)(lVar8 + 0xa8) = (int)sVar33 - local_1a10;
        *(int *)(lVar8 + 0xac) = local_1a58;
        *(int *)(lVar8 + 0xb0) = iVar13;
      }
      if (1 < (int)uVar4) {
        VP8LBitWriterReset(&bw_init,bw);
      }
    }
    VP8LBitWriterSwap(&bw_best,bw);
    WVar16 = VP8_ENC_OK;
  }
LAB_0012c0e3:
  VP8LBitWriterWipeOut(&bw_best);
  *(WebPEncodingError *)((long)input + 0x10c) = WVar16;
  return (int)(WVar16 == VP8_ENC_OK);
code_r0x0012af93:
  uVar19 = (*pcVar10)(palette[lVar56]);
  if (buffer[uVar19] == 0xffff) goto code_r0x0012afac;
  lVar45 = lVar45 + 1;
  goto LAB_0012af5d;
code_r0x0012afac:
  buffer[uVar19] = (uint16_t)lVar56;
  lVar56 = lVar56 + 1;
  goto LAB_0012af8c;
}

Assistant:

static int EncodeStreamHook(void* input, void* data2) {
  StreamEncodeContext* const params = (StreamEncodeContext*)input;
  const WebPConfig* const config = params->config_;
  const WebPPicture* const picture = params->picture_;
  VP8LBitWriter* const bw = params->bw_;
  VP8LEncoder* const enc = params->enc_;
  const int use_cache = params->use_cache_;
  const CrunchConfig* const crunch_configs = params->crunch_configs_;
  const int num_crunch_configs = params->num_crunch_configs_;
  const int red_and_blue_always_zero = params->red_and_blue_always_zero_;
#if !defined(WEBP_DISABLE_STATS)
  WebPAuxStats* const stats = params->stats_;
#endif
  WebPEncodingError err = VP8_ENC_OK;
  const int quality = (int)config->quality;
  const int low_effort = (config->method == 0);
#if (WEBP_NEAR_LOSSLESS == 1)
  const int width = picture->width;
#endif
  const int height = picture->height;
  const size_t byte_position = VP8LBitWriterNumBytes(bw);
#if (WEBP_NEAR_LOSSLESS == 1)
  int use_near_lossless = 0;
#endif
  int hdr_size = 0;
  int data_size = 0;
  int use_delta_palette = 0;
  int idx;
  size_t best_size = ~(size_t)0;
  VP8LBitWriter bw_init = *bw, bw_best;
  (void)data2;

  if (!VP8LBitWriterInit(&bw_best, 0) ||
      (num_crunch_configs > 1 && !VP8LBitWriterClone(bw, &bw_best))) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  for (idx = 0; idx < num_crunch_configs; ++idx) {
    const int entropy_idx = crunch_configs[idx].entropy_idx_;
    enc->use_palette_ =
        (entropy_idx == kPalette) || (entropy_idx == kPaletteAndSpatial);
    enc->use_subtract_green_ =
        (entropy_idx == kSubGreen) || (entropy_idx == kSpatialSubGreen);
    enc->use_predict_ = (entropy_idx == kSpatial) ||
                        (entropy_idx == kSpatialSubGreen) ||
                        (entropy_idx == kPaletteAndSpatial);
    // When using a palette, R/B==0, hence no need to test for cross-color.
    if (low_effort || enc->use_palette_) {
      enc->use_cross_color_ = 0;
    } else {
      enc->use_cross_color_ = red_and_blue_always_zero ? 0 : enc->use_predict_;
    }
    // Reset any parameter in the encoder that is set in the previous iteration.
    enc->cache_bits_ = 0;
    VP8LBackwardRefsClear(&enc->refs_[0]);
    VP8LBackwardRefsClear(&enc->refs_[1]);

#if (WEBP_NEAR_LOSSLESS == 1)
    // Apply near-lossless preprocessing.
    use_near_lossless = (config->near_lossless < 100) && !enc->use_palette_ &&
                        !enc->use_predict_;
    if (use_near_lossless) {
      err = AllocateTransformBuffer(enc, width, height);
      if (err != VP8_ENC_OK) goto Error;
      if ((enc->argb_content_ != kEncoderNearLossless) &&
          !VP8ApplyNearLossless(picture, config->near_lossless, enc->argb_)) {
        err = VP8_ENC_ERROR_OUT_OF_MEMORY;
        goto Error;
      }
      enc->argb_content_ = kEncoderNearLossless;
    } else {
      enc->argb_content_ = kEncoderNone;
    }
#else
    enc->argb_content_ = kEncoderNone;
#endif

    // Encode palette
    if (enc->use_palette_) {
      if (crunch_configs[idx].palette_sorting_type_ == kSortedDefault) {
        // Nothing to do, we have already sorted the palette.
        memcpy(enc->palette_, enc->palette_sorted_,
               enc->palette_size_ * sizeof(*enc->palette_));
      } else if (crunch_configs[idx].palette_sorting_type_ == kMinimizeDelta) {
        PaletteSortMinimizeDeltas(enc->palette_sorted_, enc->palette_size_,
                                  enc->palette_);
      } else {
        assert(crunch_configs[idx].palette_sorting_type_ == kModifiedZeng);
        err = PaletteSortModifiedZeng(enc->pic_, enc->palette_sorted_,
                                      enc->palette_size_, enc->palette_);
        if (err != VP8_ENC_OK) goto Error;
      }
      err = EncodePalette(bw, low_effort, enc);
      if (err != VP8_ENC_OK) goto Error;
      err = MapImageFromPalette(enc, use_delta_palette);
      if (err != VP8_ENC_OK) goto Error;
      // If using a color cache, do not have it bigger than the number of
      // colors.
      if (use_cache && enc->palette_size_ < (1 << MAX_COLOR_CACHE_BITS)) {
        enc->cache_bits_ = BitsLog2Floor(enc->palette_size_) + 1;
      }
    }
    if (!use_delta_palette) {
      // In case image is not packed.
      if (enc->argb_content_ != kEncoderNearLossless &&
          enc->argb_content_ != kEncoderPalette) {
        err = MakeInputImageCopy(enc);
        if (err != VP8_ENC_OK) goto Error;
      }

      // -----------------------------------------------------------------------
      // Apply transforms and write transform data.

      if (enc->use_subtract_green_) {
        ApplySubtractGreen(enc, enc->current_width_, height, bw);
      }

      if (enc->use_predict_) {
        err = ApplyPredictFilter(enc, enc->current_width_, height, quality,
                                 low_effort, enc->use_subtract_green_, bw);
        if (err != VP8_ENC_OK) goto Error;
      }

      if (enc->use_cross_color_) {
        err = ApplyCrossColorFilter(enc, enc->current_width_, height, quality,
                                    low_effort, bw);
        if (err != VP8_ENC_OK) goto Error;
      }
    }

    VP8LPutBits(bw, !TRANSFORM_PRESENT, 1);  // No more transforms.

    // -------------------------------------------------------------------------
    // Encode and write the transformed image.
    err = EncodeImageInternal(bw, enc->argb_, &enc->hash_chain_, enc->refs_,
                              enc->current_width_, height, quality, low_effort,
                              use_cache, &crunch_configs[idx],
                              &enc->cache_bits_, enc->histo_bits_,
                              byte_position, &hdr_size, &data_size);
    if (err != VP8_ENC_OK) goto Error;

    // If we are better than what we already have.
    if (VP8LBitWriterNumBytes(bw) < best_size) {
      best_size = VP8LBitWriterNumBytes(bw);
      // Store the BitWriter.
      VP8LBitWriterSwap(bw, &bw_best);
#if !defined(WEBP_DISABLE_STATS)
      // Update the stats.
      if (stats != NULL) {
        stats->lossless_features = 0;
        if (enc->use_predict_) stats->lossless_features |= 1;
        if (enc->use_cross_color_) stats->lossless_features |= 2;
        if (enc->use_subtract_green_) stats->lossless_features |= 4;
        if (enc->use_palette_) stats->lossless_features |= 8;
        stats->histogram_bits = enc->histo_bits_;
        stats->transform_bits = enc->transform_bits_;
        stats->cache_bits = enc->cache_bits_;
        stats->palette_size = enc->palette_size_;
        stats->lossless_size = (int)(best_size - byte_position);
        stats->lossless_hdr_size = hdr_size;
        stats->lossless_data_size = data_size;
      }
#endif
    }
    // Reset the bit writer for the following iteration if any.
    if (num_crunch_configs > 1) VP8LBitWriterReset(&bw_init, bw);
  }
  VP8LBitWriterSwap(&bw_best, bw);

Error:
  VP8LBitWriterWipeOut(&bw_best);
  params->err_ = err;
  // The hook should return false in case of error.
  return (err == VP8_ENC_OK);
}